

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ameth.c
# Opt level: O2

int pkey_size_gost(EVP_PKEY *pk)

{
  int iVar1;
  
  if (pk != (EVP_PKEY *)0x0) {
    iVar1 = EVP_PKEY_get_base_id();
    if ((iVar1 - 0x32bU < 7) && ((0x43U >> (iVar1 - 0x32bU & 0x1f) & 1) != 0)) {
      return 0x40;
    }
    if (iVar1 == 0x3d3) {
      return 0x40;
    }
    if (iVar1 == 0x3d4) {
      return 0x80;
    }
  }
  return -1;
}

Assistant:

static int pkey_size_gost(const EVP_PKEY *pk)
{
    if (!pk)
        return -1;

    switch (EVP_PKEY_base_id(pk)) {
    case NID_id_GostR3410_94:
    case NID_id_GostR3410_2001:
    case NID_id_GostR3410_2001DH:
    case NID_id_GostR3410_2012_256:
        return 64;
    case NID_id_GostR3410_2012_512:
        return 128;
    }

    return -1;
}